

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool lunasvg::includes(string_view *value,string_view *subvalue)

{
  char *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  basic_string_view<char,_std::char_traits<char>_> __y;
  byte local_69;
  undefined1 local_40 [8];
  string_view start;
  string_view input;
  string_view *subvalue_local;
  string_view *value_local;
  
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(subvalue);
  if (!bVar2) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length(subvalue);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(value);
    if (sVar3 <= sVar4) {
      start._M_str = (char *)value->_M_len;
      pcVar1 = value->_M_str;
      do {
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)&start._M_str);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          return false;
        }
        skipOptionalSpaces((string_view *)&start._M_str);
        local_40 = (undefined1  [8])start._M_str;
        start._M_len = (size_t)pcVar1;
        while( true ) {
          bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&start._M_str);
          local_69 = 0;
          if (!bVar2) {
            pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::front
                               ((basic_string_view<char,_std::char_traits<char>_> *)&start._M_str);
            bVar2 = IS_WS((int)*pvVar5);
            local_69 = bVar2 ^ 0xff;
          }
          if ((local_69 & 1) == 0) break;
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&start._M_str,1);
        }
        __x._M_len = subvalue->_M_len;
        __x._M_str = subvalue->_M_str;
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)&start._M_str);
        __y = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40,0,
                         sVar3 - sVar4);
        bVar2 = std::operator==(__x,__y);
      } while (!bVar2);
      return true;
    }
  }
  return false;
}

Assistant:

constexpr bool includes(const std::string_view& value, const std::string_view& subvalue)
{
    if(subvalue.empty() || subvalue.length() > value.length())
        return false;
    std::string_view input(value);
    while(!input.empty()) {
        skipOptionalSpaces(input);
        std::string_view start(input);
        while(!input.empty() && !IS_WS(input.front()))
            input.remove_prefix(1);
        if(subvalue == start.substr(0, start.length() - input.length())) {
            return true;
        }
    }

    return false;
}